

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O2

void Curl_ssl_session_destroy(Curl_ssl_session *s)

{
  Curl_llist_node *n;
  Curl_llist *pCVar1;
  Curl_llist_node *udata;
  
  if (s == (Curl_ssl_session *)0x0) {
    return;
  }
  n = &s->list;
  udata = n;
  pCVar1 = Curl_node_llist(n);
  if (pCVar1 != (Curl_llist *)0x0) {
    Curl_node_remove(n);
    return;
  }
  cf_ssl_scache_sesssion_ldestroy(udata,s);
  return;
}

Assistant:

void Curl_ssl_session_destroy(struct Curl_ssl_session *s)
{
  if(s) {
    /* if in the list, the list destructor takes care of it */
    if(Curl_node_llist(&s->list))
      Curl_node_remove(&s->list);
    else {
      cf_ssl_scache_sesssion_ldestroy(NULL, s);
    }
  }
}